

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linklist.h
# Opt level: O2

void quicly_linklist_insert_list(quicly_linklist_t *prev,quicly_linklist_t *l)

{
  st_quicly_linklist_t *psVar1;
  st_quicly_linklist_t *psVar2;
  
  if (l->prev != l) {
    l->next->prev = prev;
    psVar1 = prev->next;
    psVar2 = l->prev;
    psVar2->next = psVar1;
    psVar1->prev = psVar2;
    prev->next = l->next;
    l->next = l;
    l->prev = l;
  }
  return;
}

Assistant:

inline void quicly_linklist_insert_list(quicly_linklist_t *prev, quicly_linklist_t *l)
{
    if (quicly_linklist_is_linked(l)) {
        l->next->prev = prev;
        l->prev->next = prev->next;
        prev->next->prev = l->prev;
        prev->next = l->next;
        quicly_linklist_init(l);
    }
}